

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  byte extraout_AL;
  byte bVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar2;
  Extension *pEVar3;
  Extension *pEVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  undefined1 *puVar6;
  uint extraout_EDX;
  int index;
  undefined7 in_register_00000011;
  int key;
  int key_00;
  ExtensionSet *this_00;
  AllocatedData *this_01;
  AllocatedData *this_02;
  ulong uVar7;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar8;
  LogMessageFatal aLStack_b0 [16];
  Extension *pEStack_a0;
  AllocatedData aAStack_98 [2];
  AllocatedData aAStack_88 [2];
  ulong uStack_78;
  Extension *pEStack_70;
  ExtensionSet *pEStack_68;
  AllocatedData aAStack_60 [2];
  code *pcStack_50;
  
  puVar6 = (undefined1 *)CONCAT71(in_register_00000009,packed);
  uVar7 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  pcStack_50 = (code *)0x25a111;
  pVar8 = Insert(this,number);
  pEVar4 = pVar8.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated == false) goto LAB_0025a1a9;
    uVar5 = pEVar4->type - 0x13;
    puVar6 = (undefined1 *)(ulong)uVar5;
    if ((byte)uVar5 < 0xee) goto LAB_0025a1bd;
    puVar6 = WireFormatLite::kFieldTypeToCppTypeMap;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) != 8)
    goto LAB_0025a1c7;
    bVar1 = pEVar4->is_packed;
    if ((bool)bVar1 == packed) {
      aVar2 = pEVar4->field_0;
      goto LAB_0025a18a;
    }
  }
  else {
    pEVar4->type = (FieldType)uVar7;
    if ((byte)(type - 0x13) < 0xee) {
      pcStack_50 = (code *)0x25a1a9;
      AddEnum((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_0025a1a9:
      pcStack_50 = (code *)0x25a1b3;
      AddEnum((ExtensionSet *)&stack0xffffffffffffffc0);
    }
    else {
      puVar6 = WireFormatLite::kFieldTypeToCppTypeMap;
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 8) {
        pEVar4->is_repeated = true;
        pEVar4->field_0xa = pEVar4->field_0xa | 1;
        pEVar4->is_packed = packed;
        pcStack_50 = (code *)0x25a153;
        aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(this->arena_);
        pEVar4->field_0 = aVar2;
LAB_0025a18a:
        RepeatedField<int>::Add((RepeatedField<int> *)aVar2,value);
        return;
      }
    }
    pcStack_50 = (code *)0x25a1bd;
    AddEnum();
LAB_0025a1bd:
    pcStack_50 = (code *)0x25a1c7;
    AddEnum((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_0025a1c7:
    pcStack_50 = (code *)0x25a1d1;
    AddEnum();
    bVar1 = extraout_AL;
  }
  this_00 = (ExtensionSet *)(ulong)bVar1;
  uVar5 = (uint)packed;
  pcStack_50 = GetString;
  AddEnum();
  this_01 = aAStack_60;
  key = (int)aAStack_60;
  pEStack_68 = (ExtensionSet *)0x25a1ef;
  pcStack_50 = (code *)(ulong)(uint)value;
  pEVar3 = FindOrNull(this_00,uVar5);
  if ((pEVar3 == (Extension *)0x0) || ((pEVar3->field_0xa & 2) != 0)) {
    return;
  }
  if (pEVar3->is_repeated == false) {
    puVar6 = (undefined1 *)(ulong)pEVar3->type;
    if ((byte)(pEVar3->type - 0x13) < 0xee) goto LAB_0025a22f;
    this_01 = (AllocatedData *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)puVar6 * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)puVar6 * 4) == 9) {
      return;
    }
  }
  else {
    pEStack_68 = (ExtensionSet *)0x25a22f;
    GetString();
LAB_0025a22f:
    pEStack_68 = (ExtensionSet *)0x25a237;
    GetString();
  }
  pEStack_68 = (ExtensionSet *)0x25a23f;
  GetString();
  this_02 = aAStack_98;
  key_00 = (int)aAStack_98;
  pEStack_a0 = (Extension *)0x25a259;
  uStack_78 = uVar7;
  pEStack_70 = pEVar4;
  pEStack_68 = this;
  pVar8 = Insert((ExtensionSet *)this_01,key);
  pEVar4 = pVar8.first;
  pEVar4->descriptor = (FieldDescriptor *)puVar6;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated != false) goto LAB_0025a2e3;
    if ((byte)(pEVar4->type - 0x13) < 0xee) goto LAB_0025a2f3;
    this_02 = (AllocatedData *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 9)
    goto LAB_0025a2cb;
  }
  else {
    pEVar4->type = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      pEStack_a0 = (Extension *)0x25a2e3;
      MutableString_abi_cxx11_((ExtensionSet *)aAStack_98);
LAB_0025a2e3:
      pEStack_a0 = (Extension *)0x25a2eb;
      MutableString_abi_cxx11_((ExtensionSet *)aAStack_98);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)(extraout_EDX & 0xff) * 4) ==
             9) {
      pEVar4->is_repeated = false;
      pEVar4->field_0xa = pEVar4->field_0xa | 1;
      aAStack_98[0] = *this_01;
      pEStack_a0 = (Extension *)0x25a2a2;
      aAStack_88[0] = aAStack_98[0];
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              absl::lts_20240722::utility_internal::
              IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string>(google::protobuf::Arena*)::_lambda((auto:1&&)___)_2_>
                        ((anon_class_8_1_a7a63227 *)aAStack_98,(anon_class_8_1_a7a63227 *)aAStack_88
                        );
      pEVar4->field_0 = aVar2;
LAB_0025a2cb:
      pEVar4->field_0xa = pEVar4->field_0xa & 0xfd;
      return;
    }
    pEStack_a0 = (Extension *)0x25a2f3;
    MutableString_abi_cxx11_();
LAB_0025a2f3:
    pEStack_a0 = (Extension *)0x25a2fb;
    MutableString_abi_cxx11_((ExtensionSet *)aAStack_98);
  }
  pEStack_a0 = (Extension *)0x25a303;
  MutableString_abi_cxx11_();
  pEStack_a0 = pEVar4;
  pEVar4 = FindOrNull((ExtensionSet *)this_02,key_00);
  if (pEVar4 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,600,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_b0,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_0025a396;
  }
  if (pEVar4->is_repeated == false) {
    GetRepeatedString_abi_cxx11_();
LAB_0025a386:
    GetRepeatedString_abi_cxx11_();
  }
  else {
    if ((byte)(pEVar4->type - 0x13) < 0xee) goto LAB_0025a386;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 9) {
      RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                ((RepeatedPtrFieldBase *)pEVar4->field_0,index);
      return;
    }
  }
  GetRepeatedString_abi_cxx11_();
LAB_0025a396:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_b0);
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = packed;
    extension->ptr.repeated_enum_value =
        Arena::Create<RepeatedField<int>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    ABSL_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->ptr.repeated_enum_value->Add(value);
}